

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

String * __thiscall
LiteScript::Character::operator=(String *__return_storage_ptr__,Character *this,String *str)

{
  uint uVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  pointer pcVar2;
  
  this_00 = &this->str->str;
  uVar1 = this->i;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::erase
            (this_00,(ulong)uVar1,1);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(this_00,(ulong)uVar1,0,(str->str)._M_dataplus._M_p,(str->str)._M_string_length);
  (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2;
  pcVar2 = (str->str)._M_dataplus._M_p;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)__return_storage_ptr__,pcVar2,pcVar2 + (str->str)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

LiteScript::String LiteScript::Character::operator=(const LiteScript::String& str) {
    this->str.Replace(this->i, str);
    return str;
}